

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spritesheet.cpp
# Opt level: O0

bool __thiscall
Rml::SpritesheetList::AddSpriteSheet
          (SpritesheetList *this,String *name,String *image_source,String *definition_source,
          int definition_line_number,float display_scale,SpriteDefinitionList *sprite_definitions)

{
  uint uVar1;
  Vector2Type VVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  bool bVar3;
  size_type sVar4;
  size_type sVar5;
  reference key;
  type pSVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Sprite *new_sprite;
  Rectanglef *sprite_rectangle;
  String *sprite_name;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>
  *sprite_definition;
  const_iterator __end1;
  const_iterator __begin1;
  SpriteDefinitionList *__range1;
  shared_ptr<const_Rml::Spritesheet> local_60;
  element_type *local_50;
  Spritesheet *sprite_sheet;
  SharedPtr<Rml::Spritesheet> sprite_sheet_ptr;
  SpriteDefinitionList *sprite_definitions_local;
  float display_scale_local;
  int definition_line_number_local;
  String *definition_source_local;
  String *image_source_local;
  String *name_local;
  SpritesheetList *this_local;
  
  sprite_sheet_ptr.super___shared_ptr<Rml::Spritesheet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sprite_definitions;
  sprite_definitions_local._0_4_ = display_scale;
  sprite_definitions_local._4_4_ = definition_line_number;
  _display_scale_local = definition_source;
  definition_source_local = image_source;
  image_source_local = name;
  name_local = (String *)this;
  MakeShared<Rml::Spritesheet,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,int&,float&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sprite_sheet,name
             ,image_source,(int *)definition_source,(float *)((long)&sprite_definitions_local + 4));
  local_50 = ::std::__shared_ptr<Rml::Spritesheet,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<Rml::Spritesheet,_(__gnu_cxx::_Lock_policy)2> *)&sprite_sheet)
  ;
  ::std::shared_ptr<Rml::Spritesheet_const>::shared_ptr<Rml::Spritesheet,void>
            ((shared_ptr<Rml::Spritesheet_const> *)&local_60,
             (shared_ptr<Rml::Spritesheet> *)&sprite_sheet);
  ::std::
  vector<std::shared_ptr<const_Rml::Spritesheet>,_std::allocator<std::shared_ptr<const_Rml::Spritesheet>_>_>
  ::push_back(&this->spritesheets,(value_type *)&local_60);
  ::std::shared_ptr<const_Rml::Spritesheet>::~shared_ptr(&local_60);
  sVar4 = robin_hood::detail::
          Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Sprite,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->sprite_map);
  sVar5 = ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>_>_>
          ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>_>_>
                  *)sprite_sheet_ptr.
                    super___shared_ptr<Rml::Spritesheet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi);
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Sprite,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&this->sprite_map,sVar4 + sVar5);
  this_00 = sprite_sheet_ptr.super___shared_ptr<Rml::Spritesheet,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  __end1 = ::std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>_>_>
           ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>_>_>
                    *)sprite_sheet_ptr.
                      super___shared_ptr<Rml::Spritesheet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi);
  sprite_definition =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>
        *)::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>_>_>
          ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>_>_>
                 *)this_00._M_pi);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>_>_>_>
                                *)&sprite_definition);
    if (!bVar3) break;
    key = __gnu_cxx::
          __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>_>_>_>
          ::operator*(&__end1);
    pSVar6 = robin_hood::detail::
             Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Sprite,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]<Rml::Sprite>(&this->sprite_map,&key->first);
    if (pSVar6->sprite_sheet != (Spritesheet *)0x0) {
      uVar7 = ::std::__cxx11::string::c_str();
      TextureSource::GetDefinitionSource_abi_cxx11_(&pSVar6->sprite_sheet->texture_source);
      uVar8 = ::std::__cxx11::string::c_str();
      uVar1 = pSVar6->sprite_sheet->definition_line_number;
      uVar9 = ::std::__cxx11::string::c_str();
      Log::Message(LT_WARNING,
                   "Sprite \'%s\' was overwritten due to duplicate names at the same block scope. Declared at %s:%d and %s:%d"
                   ,uVar7,uVar8,(ulong)uVar1,uVar9,sprite_definitions_local._4_4_);
    }
    VVar2 = (key->second).p1;
    (pSVar6->rectangle).p0 = (key->second).p0;
    (pSVar6->rectangle).p1 = VVar2;
    pSVar6->sprite_sheet = local_50;
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>_>_>_>
    ::operator++(&__end1);
  }
  ::std::shared_ptr<Rml::Spritesheet>::~shared_ptr((shared_ptr<Rml::Spritesheet> *)&sprite_sheet);
  return true;
}

Assistant:

bool SpritesheetList::AddSpriteSheet(const String& name, const String& image_source, const String& definition_source, int definition_line_number,
	float display_scale, const SpriteDefinitionList& sprite_definitions)
{
	auto sprite_sheet_ptr = MakeShared<Spritesheet>(name, image_source, definition_source, definition_line_number, display_scale);
	Spritesheet* sprite_sheet = sprite_sheet_ptr.get();
	spritesheets.push_back(std::move(sprite_sheet_ptr));

	sprite_map.reserve(sprite_map.size() + sprite_definitions.size());

	// Insert all the sprites, overwriting any existing sprites already defined in the current media block scope.
	for (auto& sprite_definition : sprite_definitions)
	{
		const String& sprite_name = sprite_definition.first;
		const Rectanglef& sprite_rectangle = sprite_definition.second;

		Sprite& new_sprite = sprite_map[sprite_name];
		if (new_sprite.sprite_sheet)
		{
			Log::Message(Log::LT_WARNING, "Sprite '%s' was overwritten due to duplicate names at the same block scope. Declared at %s:%d and %s:%d",
				sprite_name.c_str(), new_sprite.sprite_sheet->texture_source.GetDefinitionSource().c_str(),
				new_sprite.sprite_sheet->definition_line_number, definition_source.c_str(), definition_line_number);
		}

		new_sprite = Sprite{sprite_rectangle, sprite_sheet};
	}

	return true;
}